

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  pointer pbVar1;
  cmMakefile *pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmLocalNinjaGenerator *this_01;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  cmGlobalNinjaGenerator *pcVar8;
  string *psVar9;
  LinkClosure *pLVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  char *pcVar12;
  cmGeneratedFileStream *pcVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  mapped_type *flags;
  mapped_type *linkFlags;
  size_t sVar16;
  cmOutputConverter *outputConverter;
  string rspfile;
  bool usedResponseFile;
  string objPath;
  key_type local_408;
  TargetType local_3e4;
  cmNinjaLinkLineDeviceComputer *local_3e0;
  cmNinjaVars vars;
  key_type local_3a8;
  cmOutputConverter *local_388;
  string *local_380;
  cmNinjaDeps orderOnlyDeps;
  string cfgName;
  string targetOutputReal;
  cmNinjaDeps local_318;
  string cudaLinkLanguage;
  cmNinjaDeps outputs;
  cmNinjaDeps emptyDeps;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps explicitDeps;
  string linkPath;
  string frameworkPath;
  string createRule;
  string targetOutputImplib;
  string objExt;
  string cuda_lang;
  ostringstream comment;
  
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&comment,"CUDA",(allocator<char> *)&vars);
  bVar5 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)pcVar8,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  if (!bVar5) {
    return;
  }
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cuda_lang,"CUDA",(allocator<char> *)&comment);
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  pLVar10 = cmGeneratorTarget::GetLinkClosure(this_00,psVar9);
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((pLVar10->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pLVar10->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&cuda_lang);
  pbVar1 = (pLVar10->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&comment,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&vars);
  pcVar12 = cmGeneratorTarget::GetProperty(this_00,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  if (pcVar12 == (char *)0x0) {
    TVar6 = cmGeneratorTarget::GetType(this_00);
    if (((MODULE_LIBRARY < TVar6) || (TVar6 == STATIC_LIBRARY)) || (_Var11._M_current == pbVar1))
    goto LAB_001d5bec;
  }
  else {
    bVar5 = cmSystemTools::IsOn(pcVar12);
    if (!bVar5 || _Var11._M_current == pbVar1) goto LAB_001d5bec;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cudaLinkLanguage,"CUDA",(allocator<char> *)&comment);
  pcVar2 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&comment,"CMAKE_CUDA_OUTPUT_EXTENSION",(allocator<char> *)&vars);
  psVar9 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&comment);
  std::__cxx11::string::string((string *)&objExt,(string *)psVar9);
  std::__cxx11::string::~string((string *)&comment);
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string((string *)&cfgName,(string *)psVar9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                 &this_00->ObjectDirectory,"cmake_device_link");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,&objExt)
  ;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputReal,&this->super_cmNinjaTargetGenerator,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::~string((string *)&vars);
  cmGeneratorTarget::GetFullPath((string *)&comment,this_00,&cfgName,ImportLibraryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
  pcVar13 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar13);
  local_3e4 = cmGeneratorTarget::GetType(this_00);
  pcVar13 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  poVar14 = std::operator<<((ostream *)pcVar13,"# Device Link build statements for ");
  pcVar12 = cmState::GetTargetTypeName(local_3e4);
  poVar14 = std::operator<<(poVar14,pcVar12);
  poVar14 = std::operator<<(poVar14," target ");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&comment,&this->super_cmNinjaTargetGenerator);
  poVar14 = std::operator<<(poVar14,(string *)&comment);
  std::operator<<(poVar14,"\n\n");
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  poVar14 = std::operator<<((ostream *)&comment,"Link the ");
  pcVar12 = GetVisibleTypeName(this);
  poVar14 = std::operator<<(poVar14,pcVar12);
  poVar14 = std::operator<<(poVar14," ");
  std::operator<<(poVar14,(string *)&targetOutputReal);
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,&(this->super_cmNinjaTargetGenerator).Objects);
  local_380 = &this->TargetLinkLanguage;
  cmNinjaTargetGenerator::ComputeLinkDeps
            (&implicitDeps,&this->super_cmNinjaTargetGenerator,local_380);
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,this_00,local_380,psVar9);
  pcVar2 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::operator+(&objPath,&createRule,"_USE_WATCOM_QUOTE");
  bVar5 = cmMakefile::IsOn(pcVar2,&objPath);
  std::__cxx11::string::~string((string *)&objPath);
  pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_388 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
  ;
  cmOutputConverter::ConvertToOutputFormat(&objPath,local_388,&targetOutputReal,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"TARGET_FILE",(allocator<char> *)&local_408);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  local_3e0 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
  this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  outputConverter =
       &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_01 == (cmLocalNinjaGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&rspfile,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&objPath,(cmStateSnapshot *)&rspfile);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (local_3e0,outputConverter,(cmStateDirectory *)&objPath,pcVar8);
  cmLinkLineComputer::SetUseWatcomQuote((cmLinkLineComputer *)local_3e0,bVar5);
  psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objPath,"LINK_LIBRARIES",(allocator<char> *)&local_3a8);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"FLAGS",(allocator<char> *)&orderOnlyDeps);
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&rspfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"LINK_FLAGS",(allocator<char> *)&local_318);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_408);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)pcVar3,(cmLinkLineComputer *)local_3e0,psVar9,pmVar15,flags,
             linkFlags,&frameworkPath,&linkPath,this_00);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objPath,"JOB_POOL_LINK",(allocator<char> *)&rspfile);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&objPath,this_00,&vars);
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"LINK_FLAGS",(allocator<char> *)&local_3a8);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  cmGlobalNinjaGenerator::EncodeLiteral(&objPath,pmVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"LINK_FLAGS",(allocator<char> *)&orderOnlyDeps);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_408);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::~string((string *)&rspfile);
  cmCommonTargetGenerator::GetManifests_abi_cxx11_(&objPath,(cmCommonTargetGenerator *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"MANIFESTS",(allocator<char> *)&local_408);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  std::operator+(&objPath,&frameworkPath,&linkPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"LINK_PATH",(allocator<char> *)&local_408);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&objPath);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  if (local_3e4 == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"FLAGS",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::string((string *)&objPath,(string *)pmVar15);
    std::__cxx11::string::~string((string *)&rspfile);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar3,&objPath,this_00,&cudaLinkLanguage,&cfgName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"FLAGS",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar15);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"ARCH_FLAGS",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::string((string *)&objPath,(string *)pmVar15);
    std::__cxx11::string::~string((string *)&rspfile);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar3,&objPath,this_00,&cudaLinkLanguage,&cfgName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"ARCH_FLAGS",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar15);
    std::__cxx11::string::~string((string *)&rspfile);
    objPath._M_string_length = 0;
    *objPath._M_dataplus._M_p = '\0';
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)pcVar3,&objPath,this_00,&cudaLinkLanguage,&cfgName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"LANGUAGE_COMPILE_FLAGS",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar15);
  }
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  bVar5 = cmGeneratorTarget::HasSOName
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&cfgName);
  if (bVar5) {
    cmMakefile::GetSONameFlag
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,local_380
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"SONAME_FLAG",(allocator<char> *)&rspfile);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::assign((char *)pmVar15);
    std::__cxx11::string::~string((string *)&objPath);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"SONAME",(allocator<char> *)&rspfile);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar15);
    std::__cxx11::string::~string((string *)&objPath);
    if (local_3e4 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,&cfgName);
      if (objPath._M_string_length != 0) {
        cmOutputConverter::ConvertToOutputFormat(&rspfile,local_388,&objPath,SHELL);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"INSTALLNAME_DIR",(allocator<char> *)&local_3a8);
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&local_408);
        std::__cxx11::string::operator=((string *)pmVar15,(string *)&rspfile);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&rspfile);
      }
      std::__cxx11::string::~string((string *)&objPath);
    }
  }
  if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat(&objPath,local_388,&targetOutputImplib,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"TARGET_IMPLIB",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar15);
    std::__cxx11::string::~string((string *)&rspfile);
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&objPath);
    std::__cxx11::string::~string((string *)&objPath);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&local_408,&this->super_cmNinjaTargetGenerator,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            (&rspfile,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       super_cmOutputConverter,&local_408,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"OBJECT_DIR",(allocator<char> *)&orderOnlyDeps);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&local_3a8);
  std::__cxx11::string::operator=((string *)pmVar15,(string *)&rspfile);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&local_408);
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(&this->super_cmNinjaTargetGenerator,&vars);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  if (pcVar8->UsingGCCOnWindows == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"LINK_LIBRARIES",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::~string((string *)&rspfile);
    _Var4._M_current = (pmVar15->_M_dataplus)._M_p;
    rspfile._M_dataplus._M_p._0_1_ = 0x5c;
    local_408._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var4._M_current + pmVar15->_M_string_length),(char *)&rspfile,
               (char *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"LINK_PATH",(allocator<char> *)&local_408);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::~string((string *)&rspfile);
    _Var4._M_current = (pmVar15->_M_dataplus)._M_p;
    rspfile._M_dataplus._M_p._0_1_ = 0x5c;
    local_408._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var4._M_current + pmVar15->_M_string_length),(char *)&rspfile,
               (char *)&local_408);
  }
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  sVar16 = cmSystemTools::CalculateCommandLineLengthLimit();
  LanguageLinkerDeviceRule_abi_cxx11_(&rspfile,this);
  iVar7 = cmGlobalNinjaGenerator::GetRuleCmdLength(pcVar8,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&orderOnlyDeps,"CMakeFiles/",(allocator<char> *)&local_318);
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
  std::operator+(&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&orderOnlyDeps
                 ,psVar9);
  std::operator+(&local_408,&local_3a8,".rsp");
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&rspfile,&this->super_cmNinjaTargetGenerator,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&orderOnlyDeps);
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps,DependOnTargetArtifact);
  usedResponseFile = false;
  pcVar13 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerDeviceRule_abi_cxx11_(&local_3a8,this);
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar8,(ostream *)pcVar13,&local_408,&local_3a8,&outputs,&local_318,&explicitDeps,
             &implicitDeps,&orderOnlyDeps,&vars,&rspfile,(int)sVar16 - iVar7,&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_408);
  WriteDeviceLinkRule(this,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&objPath);
  (*(local_3e0->super_cmLinkLineDeviceComputer).super_cmLinkLineComputer._vptr_cmLinkLineComputer[1]
  )();
  std::__cxx11::string::~string((string *)&createRule);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::__cxx11::string::~string((string *)&targetOutputImplib);
  std::__cxx11::string::~string((string *)&targetOutputReal);
  std::__cxx11::string::~string((string *)&cfgName);
  std::__cxx11::string::~string((string *)&objExt);
  std::__cxx11::string::~string((string *)&cudaLinkLanguage);
LAB_001d5bec:
  std::__cxx11::string::~string((string *)&cuda_lang);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  if (!this->GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return;
  }

  cmGeneratorTarget& genTarget = *this->GetGeneratorTarget();

  // determine if we need to do any device linking for this target
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    genTarget.GetLinkClosure(this->GetConfigName());

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool doDeviceLinking = false;
  if (const char* resolveDeviceSymbols =
        genTarget.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
  } else {
    switch (genTarget.GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::EXECUTABLE:
        doDeviceLinking = true;
        break;
      default:
        break;
    }
  }

  if (!(doDeviceLinking && hasCUDA)) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget.ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget.GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget.GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      this->GetGlobalGenerator()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, &genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", &genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    localGen.AddLanguageFlagsForLinking(t, &genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen.GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  const std::string rspfile = this->ConvertToNinjaPath(
    std::string("CMakeFiles/") + genTarget.GetName() + ".rsp");

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerDeviceRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(false);
}